

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse.h
# Opt level: O1

double mvm::num::parse<double,8ul,mvm::num::big_endian_tag>(uint8_t *bytes)

{
  ulong uVar1;
  double dVar2;
  array<unsigned_char,_8UL> bytes_arr;
  array<unsigned_char,_8UL> local_8;
  
  uVar1 = *(ulong *)bytes;
  local_8._M_elems =
       (_Type)(uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
  dVar2 = parse_floating<double,8ul>(&local_8);
  return dVar2;
}

Assistant:

auto parse(uint8_t const *bytes) {
  auto bytes_arr = details::to_endian<N, Endian, little_endian_tag>()(bytes);

  if constexpr (std::is_floating_point_v<T>) {
    return parse_floating<T>(bytes_arr);
  } else if constexpr (std::is_integral_v<T> && std::is_unsigned_v<T>) {
    return parse_unsigned<T>(bytes_arr);
  } else if constexpr (std::is_integral_v<T> && std::is_signed_v<T>) {
    return parse_signed<T>(bytes_arr);
  }
}